

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O3

vector<duckdb::MetaBlockPointer,_true> * __thiscall
duckdb::RowGroup::CheckpointDeletes
          (vector<duckdb::MetaBlockPointer,_true> *__return_storage_ptr__,RowGroup *this,
          MetadataManager *manager)

{
  optional_ptr<duckdb::RowVersionManager,_true> vinfo;
  optional_ptr<duckdb::RowVersionManager,_true> local_20;
  
  if (((this->deletes_pointers).
       super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       _M_impl.super__Vector_impl_data._M_start ==
       (this->deletes_pointers).
       super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       _M_impl.super__Vector_impl_data._M_finish) ||
     (((this->deletes_is_loaded)._M_base._M_i & 1U) != 0)) {
    local_20 = GetVersionInfo(this);
    if (local_20.ptr == (RowVersionManager *)0x0) {
      (__return_storage_ptr__->
      super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
      super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
      super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
      super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      optional_ptr<duckdb::RowVersionManager,_true>::CheckValid(&local_20);
      RowVersionManager::Checkpoint(__return_storage_ptr__,local_20.ptr,manager);
    }
  }
  else {
    MetadataManager::ClearModifiedBlocks(manager,&this->deletes_pointers);
    ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::vector
              (&__return_storage_ptr__->
                super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>,
               &(this->deletes_pointers).
                super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<MetaBlockPointer> RowGroup::CheckpointDeletes(MetadataManager &manager) {
	if (HasUnloadedDeletes()) {
		// deletes were not loaded so they cannot be changed
		// re-use them as-is
		manager.ClearModifiedBlocks(deletes_pointers);
		return deletes_pointers;
	}
	auto vinfo = GetVersionInfo();
	if (!vinfo) {
		// no version information: write nothing
		return vector<MetaBlockPointer>();
	}
	return vinfo->Checkpoint(manager);
}